

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::_::
CopyConstructArray_<capnp::compiler::BrandedDecl,_capnp::compiler::BrandedDecl_*,_false,_false>::
ExceptionGuard::~ExceptionGuard(ExceptionGuard *this)

{
  BrandedDecl *this_00;
  
  while (this->start < this->pos) {
    this_00 = this->pos + -1;
    this->pos = this_00;
    capnp::compiler::BrandedDecl::~BrandedDecl(this_00);
  }
  return;
}

Assistant:

~ExceptionGuard() noexcept(false) {
      while (pos > start) {
        dtor(*--pos);
      }
    }